

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.hpp
# Opt level: O1

Node * __thiscall
kdtree::
KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
::buildKDTree(KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
              *this,vector<int_*,_std::allocator<int_*>_> *values,uint depth)

{
  int iVar1;
  __normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_> _Var2;
  __normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_> __last;
  int *piVar3;
  pointer ppiVar4;
  int *piVar5;
  int *piVar6;
  Node *pNVar7;
  Node *pNVar8;
  Node *pNVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  int *piVar13;
  uint uVar14;
  ulong uVar15;
  undefined1 local_78 [8];
  vector<int_*,_std::allocator<int_*>_> rightValues;
  vector<int_*,_std::allocator<int_*>_> leftValues;
  allocator_type local_35;
  uint local_34 [2];
  uint depth_local;
  
  _Var2._M_current =
       (values->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  __last._M_current =
       (values->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  uVar14 = (uint)((long)__last._M_current - (long)_Var2._M_current >> 3);
  local_34[0] = depth;
  if (uVar14 == 1) {
    pNVar7 = (Node *)operator_new(0x18);
    piVar3 = *_Var2._M_current;
    pNVar7->left = (Node *)0x0;
    pNVar7->right = (Node *)0x0;
    pNVar7->value = piVar3;
  }
  else {
    uVar15 = (ulong)(uVar14 >> 1 & 0x3fffffff);
    rightValues.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_34;
    std::
    __heap_select<__gnu_cxx::__normal_iterator<int**,std::vector<int*,std::allocator<int*>>>,__gnu_cxx::__ops::_Iter_comp_iter<kdtree::KDTree<int,5u,kdtree::default_new<int,5>,kdtree::default_delete<int>,kdtree::default_set<int>,kdtree::default_less<int>>::buildKDTree(std::vector<int*,std::allocator<int*>>&,unsigned_int)::_lambda(int*,int*)_1_>>
              (_Var2,(__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>)
                     (_Var2._M_current + uVar15 + 1),__last,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_schenker[P]KDTree_KDTree_hpp:81:6)>
                )rightValues.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
    std::
    __sort_heap<__gnu_cxx::__normal_iterator<int**,std::vector<int*,std::allocator<int*>>>,__gnu_cxx::__ops::_Iter_comp_iter<kdtree::KDTree<int,5u,kdtree::default_new<int,5>,kdtree::default_delete<int>,kdtree::default_set<int>,kdtree::default_less<int>>::buildKDTree(std::vector<int*,std::allocator<int*>>&,unsigned_int)::_lambda(int*,int*)_1_>>
              (_Var2,(__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>)
                     (_Var2._M_current + uVar15 + 1),
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_schenker[P]KDTree_KDTree_hpp:81:6)>
                *)&rightValues.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
    _Var2._M_current =
         (values->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.super__Vector_impl_data
         ._M_start;
    std::vector<int*,std::allocator<int*>>::
    vector<__gnu_cxx::__normal_iterator<int**,std::vector<int*,std::allocator<int*>>>,void>
              ((vector<int*,std::allocator<int*>> *)
               &rightValues.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,_Var2,
               (__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>)
               (_Var2._M_current + uVar15),(allocator_type *)local_78);
    std::vector<int*,std::allocator<int*>>::
    vector<__gnu_cxx::__normal_iterator<int**,std::vector<int*,std::allocator<int*>>>,void>
              ((vector<int*,std::allocator<int*>> *)local_78,
               (__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>)
               ((values->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
                super__Vector_impl_data._M_start + uVar15),
               (__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>)
               (values->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
               super__Vector_impl_data._M_finish,&local_35);
    pNVar8 = buildKDTree(this,(vector<int_*,_std::allocator<int_*>_> *)
                              &rightValues.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl
                               .super__Vector_impl_data._M_end_of_storage,local_34[0] + 1);
    pNVar9 = buildKDTree(this,(vector<int_*,_std::allocator<int_*>_> *)local_78,local_34[0] + 1);
    pNVar7 = (Node *)operator_new(0x18);
    ppiVar4 = (values->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(values->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppiVar4 >> 3) <= uVar15) {
      uVar10 = std::__throw_out_of_range_fmt
                         ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          ,uVar15);
      operator_delete(pNVar7);
      if (local_78 != (undefined1  [8])0x0) {
        operator_delete((void *)local_78);
      }
      if (rightValues.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(rightValues.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
      }
      _Unwind_Resume(uVar10);
    }
    piVar3 = ppiVar4[uVar15];
    pNVar7->left = pNVar8;
    pNVar7->right = pNVar9;
    pNVar7->value = piVar3;
    if (local_78 != (undefined1  [8])0x0) {
      operator_delete((void *)local_78);
    }
    if (rightValues.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(rightValues.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    }
  }
  piVar3 = pNVar7->value;
  piVar5 = this->boundingBoxMin;
  piVar6 = this->boundingBoxMax;
  lVar11 = 0;
  lVar12 = 0;
  do {
    iVar1 = *(int *)((long)piVar3 + lVar11);
    if (iVar1 < *(int *)((long)piVar5 + lVar11)) {
      piVar13 = piVar5 + lVar12;
LAB_00102a9c:
      *piVar13 = iVar1;
    }
    else if (*(int *)((long)piVar6 + lVar11) < iVar1) {
      piVar13 = (int *)((long)piVar6 + lVar11);
      goto LAB_00102a9c;
    }
    lVar12 = lVar12 + 1;
    lVar11 = lVar11 + 4;
    if (lVar11 == 0x14) {
      return pNVar7;
    }
  } while( true );
}

Assistant:

Node *buildKDTree(std::vector<T*> &values, const unsigned int depth = 0) {
			Node *result;

			const int numberOfValues = values.size();

			if (numberOfValues == 1) {
				result = new Node(values.front());
			}
			else if (numberOfValues > 0) {

				std::partial_sort(values.begin(), values.begin() + (numberOfValues / 2) + 1, values.end(),
					[&depth](T *i, T *j) {
					return LESS()(i, j, depth%dim);
				});

				const int pivot = numberOfValues / 2;

				std::vector<T*> leftValues(values.begin(), values.begin() + pivot);
				std::vector<T*> rightValues(values.begin() + pivot, values.end());

				Node *leftNode = buildKDTree(leftValues, depth + 1);
				Node *rightNode = buildKDTree(rightValues, depth + 1);

				result = new Node(values.at(pivot), leftNode, rightNode);
			}
			else { // values.empty()
				result = 0;
			}

			updateBoundingBox(result);

			return result;
		}